

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_entity.cxx
# Opt level: O0

void __thiscall
xray_re::cse_alife_item_weapon_shotgun::update_write
          (cse_alife_item_weapon_shotgun *this,xr_packet *packet)

{
  xr_packet *pxVar1;
  size_type sVar2;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_30;
  xr_packet *local_18;
  xr_packet *packet_local;
  cse_alife_item_weapon_shotgun *this_local;
  
  local_18 = packet;
  packet_local = (xr_packet *)this;
  cse_alife_item_weapon_magazined::update_write(&this->super_cse_alife_item_weapon_magazined,packet)
  ;
  pxVar1 = local_18;
  sVar2 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(&this->m_ammo_ids);
  (*pxVar1->_vptr_xr_packet[0x15])(pxVar1,sVar2);
  pxVar1 = local_18;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector(&local_30,&this->m_ammo_ids);
  (*pxVar1->_vptr_xr_packet[1])(pxVar1,&local_30);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector(&local_30);
  return;
}

Assistant:

void cse_alife_item_weapon_shotgun::update_write(xr_packet& packet)
{
	cse_alife_item_weapon_magazined::update_write(packet);
	packet.w_size_u8(m_ammo_ids.size());
	packet.w_seq(m_ammo_ids);
}